

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void canvas_addtemplatesforscalar
               (t_symbol *templatesym,t_word *w,int *p_ntemplates,t_symbol ***p_templatevec)

{
  int iVar1;
  uint uVar2;
  _array *p_Var3;
  t_symbol *templatesym_00;
  t_template *ptVar4;
  t_dataslot *ptVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  t_word *local_48;
  
  ptVar4 = template_findbyname(templatesym);
  canvas_doaddtemplate(templatesym,p_ntemplates,p_templatevec);
  if (ptVar4 != (t_template *)0x0) {
    ptVar5 = ptVar4->t_vec;
    iVar6 = ptVar4->t_n;
    local_48 = w;
    while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
      if (ptVar5->ds_type == 3) {
        p_Var3 = local_48->w_array;
        iVar1 = p_Var3->a_elemsize;
        uVar2 = p_Var3->a_n;
        templatesym_00 = ptVar5->ds_arraytemplate;
        canvas_doaddtemplate(templatesym_00,p_ntemplates,p_templatevec);
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        uVar8 = (ulong)uVar2;
        lVar7 = 0;
        while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
          canvas_addtemplatesforscalar
                    (templatesym_00,(t_word *)(p_Var3->a_vec + lVar7),p_ntemplates,p_templatevec);
          lVar7 = lVar7 + iVar1;
        }
      }
      ptVar5 = ptVar5 + 1;
      local_48 = local_48 + 1;
    }
    return;
  }
  bug("canvas_addtemplatesforscalar");
  return;
}

Assistant:

static void canvas_addtemplatesforscalar(t_symbol *templatesym,
    t_word *w, int *p_ntemplates, t_symbol ***p_templatevec)
{
    t_dataslot *ds;
    int i;
    t_template *template = template_findbyname(templatesym);
    canvas_doaddtemplate(templatesym, p_ntemplates, p_templatevec);
    if (!template)
        bug("canvas_addtemplatesforscalar");
    else for (ds = template->t_vec, i = template->t_n; i--; ds++, w++)
    {
        if (ds->ds_type == DT_ARRAY)
        {
            int j;
            t_array *a = w->w_array;
            int elemsize = a->a_elemsize, nitems = a->a_n;
            t_symbol *arraytemplatesym = ds->ds_arraytemplate;
            canvas_doaddtemplate(arraytemplatesym, p_ntemplates, p_templatevec);
            for (j = 0; j < nitems; j++)
                canvas_addtemplatesforscalar(arraytemplatesym,
                    (t_word *)(((char *)a->a_vec) + elemsize * j),
                        p_ntemplates, p_templatevec);
        }
    }
}